

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ResourceDataValue::getStringOrFirstOfArray
          (UnicodeString *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  ResourceData *pResData;
  UBool UVar1;
  int32_t iVar2;
  uint32_t res;
  UChar *pUVar3;
  ConstChar16Ptr local_70;
  undefined1 local_68 [8];
  ResourceArray array;
  UChar *s;
  int32_t sLength;
  undefined1 local_21;
  UErrorCode *local_20;
  UErrorCode *errorCode_local;
  ResourceDataValue *this_local;
  UnicodeString *us;
  
  local_21 = 0;
  local_20 = errorCode;
  errorCode_local = (UErrorCode *)this;
  this_local = (ResourceDataValue *)__return_storage_ptr__;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  UVar1 = ::U_FAILURE(*local_20);
  if (UVar1 == '\0') {
    pUVar3 = res_getString_63(this->pResData,this->res,(int32_t *)((long)&s + 4));
    if (pUVar3 == (UChar *)0x0) {
      (*(this->super_ResourceValue).super_UObject._vptr_UObject[10])(local_68,this,local_20);
      UVar1 = ::U_FAILURE(*local_20);
      if (UVar1 == '\0') {
        iVar2 = ResourceArray::getSize((ResourceArray *)local_68);
        if (0 < iVar2) {
          pResData = this->pResData;
          res = ResourceArray::internalGetResource((ResourceArray *)local_68,pResData,0);
          pUVar3 = res_getString_63(pResData,res,(int32_t *)((long)&s + 4));
          if (pUVar3 != (UChar *)0x0) {
            ConstChar16Ptr::ConstChar16Ptr(&local_70,pUVar3);
            UnicodeString::setTo(__return_storage_ptr__,'\x01',&local_70,s._4_4_);
            ConstChar16Ptr::~ConstChar16Ptr(&local_70);
            return __return_storage_ptr__;
          }
        }
        *local_20 = U_RESOURCE_TYPE_MISMATCH;
      }
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&array.length,pUVar3);
      UnicodeString::setTo(__return_storage_ptr__,'\x01',(ConstChar16Ptr *)&array.length,s._4_4_);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&array.length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceDataValue::getStringOrFirstOfArray(UErrorCode &errorCode) const {
    UnicodeString us;
    if(U_FAILURE(errorCode)) {
        return us;
    }
    int32_t sLength;
    const UChar *s = res_getString(pResData, res, &sLength);
    if(s != NULL) {
        us.setTo(TRUE, s, sLength);
        return us;
    }
    ResourceArray array = getArray(errorCode);
    if(U_FAILURE(errorCode)) {
        return us;
    }
    if(array.getSize() > 0) {
        s = res_getString(pResData, array.internalGetResource(pResData, 0), &sLength);
        if(s != NULL) {
            us.setTo(TRUE, s, sLength);
            return us;
        }
    }
    errorCode = U_RESOURCE_TYPE_MISMATCH;
    return us;
}